

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

void __thiscall
WScriptJsrt::CallbackMessage::CallbackMessage(CallbackMessage *this,uint time,JsValueRef function)

{
  JsErrorCode JVar1;
  JsErrorCode error;
  JsValueRef function_local;
  uint time_local;
  CallbackMessage *this_local;
  
  MessageBase::MessageBase(&this->super_MessageBase,time);
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__CallbackMessage_001d2228;
  this->m_function = function;
  JVar1 = ChakraRTInterface::JsAddRef(this->m_function,(uint *)0x0);
  if (JVar1 != JsNoError) {
    PAL_wprintf(L"FATAL ERROR: ChakraRTInterface::JsAddRef failed in WScriptJsrt::CallbackMessage::`ctor`. error=0x%x\n"
                ,(ulong)JVar1);
    PAL_exit(1);
  }
  return;
}

Assistant:

WScriptJsrt::CallbackMessage::CallbackMessage(unsigned int time, JsValueRef function) : MessageBase(time), m_function(function)
{
    JsErrorCode error = ChakraRTInterface::JsAddRef(m_function, nullptr);
    if (error != JsNoError)
    {
        // Simply report a fatal error and exit because continuing from this point would result in inconsistent state
        // and FailFast telemetry would not be useful.
        wprintf(_u("FATAL ERROR: ChakraRTInterface::JsAddRef failed in WScriptJsrt::CallbackMessage::`ctor`. error=0x%x\n"), error);
        exit(1);
    }
}